

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
UA_Server_editNode(UA_Server *server,UA_Session *session,UA_NodeId *nodeId,
                  UA_EditNodeCallback callback,void *data)

{
  UA_StatusCode UVar1;
  UA_NodeStoreEntry **ppUVar2;
  UA_Node *pUVar3;
  
  ppUVar2 = findNode(server->nodestore,nodeId);
  if (ppUVar2 == (UA_NodeStoreEntry **)0x0) {
    pUVar3 = (UA_Node *)0x0;
  }
  else {
    pUVar3 = &(*ppUVar2)->node;
  }
  if (pUVar3 != (UA_Node *)0x0) {
    UVar1 = (*callback)(server,session,pUVar3,data);
    return UVar1;
  }
  return 0x80340000;
}

Assistant:

UA_StatusCode
UA_Server_editNode(UA_Server *server, UA_Session *session,
                   const UA_NodeId *nodeId, UA_EditNodeCallback callback,
                   const void *data) {
#ifndef UA_ENABLE_MULTITHREADING
    const UA_Node *node = UA_NodeStore_get(server->nodestore, nodeId);
    if(!node)
        return UA_STATUSCODE_BADNODEIDUNKNOWN;
    UA_Node *editNode = (UA_Node*)(uintptr_t)node; // dirty cast
    return callback(server, session, editNode, data);
#else
    UA_StatusCode retval;
    do {
        UA_Node *copy = UA_NodeStore_getCopy(server->nodestore, nodeId);
        if(!copy)
            return UA_STATUSCODE_BADOUTOFMEMORY;
        retval = callback(server, session, copy, data);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_NodeStore_deleteNode(copy);
            return retval;
        }
        retval = UA_NodeStore_replace(server->nodestore, copy);
    } while(retval != UA_STATUSCODE_GOOD);
    return UA_STATUSCODE_GOOD;
#endif
}